

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void find_rectangles(Mat *image,
                    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    *rectangles)

{
  Size *pSVar1;
  int iVar2;
  Size SVar3;
  double dVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  Mat *this;
  int j;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> approx;
  int ch [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  Mat gray0;
  Mat blurred;
  Mat gray;
  undefined1 local_4f8 [8];
  Mat *pMStack_4f0;
  pointer local_4e8;
  int local_4d4;
  int local_4d0 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_4c8;
  _OutputArray local_4a8;
  _InputArray local_490;
  undefined1 local_478 [8];
  undefined8 uStack_470;
  Size SStack_468;
  Size SStack_460;
  uchar *local_458;
  uchar *puStack_450;
  MatAllocator *local_448;
  UMatData *pUStack_440;
  MatSize local_438;
  size_t *local_430;
  size_t local_428 [3];
  ulong local_410;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  Mat local_3d0;
  _InputArray local_370;
  _InputArray local_358;
  _InputArray local_340;
  Mat local_328;
  double local_2c8;
  undefined8 uStack_2c0;
  ulong local_2b8;
  undefined1 local_2b0 [8];
  undefined8 local_2a8;
  Size local_2a0;
  Size SStack_298;
  uchar *local_290;
  uchar *puStack_288;
  MatAllocator *local_280;
  UMatData *pUStack_278;
  MatSize local_270;
  UMatData *local_268;
  MatSize local_260;
  size_t *psStack_258;
  Mat local_240;
  Mat local_1e0;
  undefined1 local_150 [16];
  Size SStack_140;
  Mat local_f0;
  Mat local_90;
  
  local_408 = rectangles;
  cv::Mat::Mat(&local_f0,image);
  local_2a0.width = 0;
  local_2a0.height = 0;
  local_2b0._0_4_ = 0x1010000;
  SStack_140.width = 0;
  SStack_140.height = 0;
  local_150._0_4_ = 0x2010000;
  local_2a8 = image;
  local_150._8_8_ = &local_f0;
  cv::medianBlur((_InputArray *)local_2b0,(_OutputArray *)local_150,9);
  local_2b8 = *(ulong *)local_f0.size.p << 0x20 | *(ulong *)local_f0.size.p >> 0x20;
  cv::Mat::Mat((Mat *)local_150,&local_2b8,0);
  cv::Mat::Mat(&local_90);
  local_4c8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = 0;
  do {
    local_4d0[1] = 0;
    local_4d4 = iVar7;
    local_4d0[0] = iVar7;
    cv::mixChannels(&local_f0,1,(Mat *)local_150,1,local_4d0,1);
    uVar9 = 0;
    do {
      local_410 = uVar9;
      if ((int)uVar9 == 0) {
        local_2a0.width = 0;
        local_2a0.height = 0;
        local_2b0._0_4_ = 0x1010000;
        local_2a8 = (Mat *)local_150;
        SStack_468.width = 0;
        SStack_468.height = 0;
        local_478._0_4_ = 0x2010000;
        uStack_470 = &local_90;
        cv::Canny((_InputArray *)local_2b0,(_OutputArray *)local_478,10.0,20.0,3,false);
        local_4e8 = (pointer)0x0;
        local_4f8._0_4_ = 0x1010000;
        local_490.sz.width = 0;
        local_490.sz.height = 0;
        local_490.flags = 0x2010000;
        pMStack_4f0 = &local_90;
        local_490.obj = &local_90;
        cv::Mat::Mat((Mat *)local_2b0);
        local_4a8.super__InputArray.sz.width = 0;
        local_4a8.super__InputArray.sz.height = 0;
        local_4a8.super__InputArray.flags = 0x1010000;
        local_3d8 = 0xffffffffffffffff;
        local_478 = (undefined1  [8])0x7fefffffffffffff;
        uStack_470 = (Mat *)0x7fefffffffffffff;
        SStack_468.width = -1;
        SStack_468.height = 0x7fefffff;
        SStack_460.width = -1;
        SStack_460.height = 0x7fefffff;
        local_4a8.super__InputArray.obj = (Mat *)local_2b0;
        cv::dilate(local_4f8,&local_490,&local_4a8,&local_3d8,1,0,local_478);
        this = (Mat *)local_2b0;
      }
      else {
        cv::operator>=((Mat *)local_2b0,255.0);
        (**(code **)(*(long *)local_2b0 + 0x18))(local_2b0,(Mat *)local_2b0,&local_90,0xffffffff);
        cv::Mat::~Mat(&local_1e0);
        cv::Mat::~Mat(&local_240);
        this = (Mat *)&local_2a0;
      }
      cv::Mat::~Mat(this);
      local_2a0.width = 0;
      local_2a0.height = 0;
      local_2b0._0_4_ = 0x1010000;
      SStack_468.width = 0;
      SStack_468.height = 0;
      local_478._0_4_ = 0x8204000c;
      uStack_470 = (Mat *)&local_4c8;
      local_3e0 = 0;
      local_2a8 = &local_90;
      cv::findContours((Mat *)local_2b0,local_478,1,2,&local_3e0);
      local_4f8 = (undefined1  [8])0x0;
      pMStack_4f0 = (Mat *)0x0;
      local_4e8 = (pointer)0x0;
      if (local_4c8.
          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_4c8.
          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar9 = 0;
        do {
          local_2b0 = (undefined1  [8])&DAT_242ff400c;
          local_2a8 = (Mat *)CONCAT44(1,(int)((ulong)(*(long *)((long)local_4c8.
                                                                                                                                            
                                                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  uVar9 * 0x18 + 8) -
                                                  *(long *)((long)local_4c8.
                                                                                                                                    
                                                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  uVar9 * 0x18)) >> 3));
          local_280 = (MatAllocator *)0x0;
          pUStack_278 = (UMatData *)0x0;
          puStack_288 = (uchar *)0x0;
          SStack_298.width = 0;
          SStack_298.height = 0;
          local_270.p = (int *)&local_2a8;
          local_268 = (UMatData *)&local_260;
          local_260.p = (int *)0x0;
          psStack_258 = (size_t *)0x0;
          SVar3 = *(Size *)((long)local_4c8.
                                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar9 * 0x18);
          if (SVar3 != *(Size *)((long)local_4c8.
                                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar9 * 0x18 + 8)
             ) {
            psStack_258 = (size_t *)0x8;
            local_260.p = (int *)0x8;
            puStack_288 = (uchar *)(((*(long *)((long)local_4c8.
                                                                                                            
                                                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                               uVar9 * 0x18 + 8) -
                                     *(long *)((long)local_4c8.
                                                                                                          
                                                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                              uVar9 * 0x18)) * 0x20000000 >> 0x1d &
                                    0xfffffffffffffff8U) + (long)SVar3);
            SStack_298 = SVar3;
          }
          pSVar1 = (Size *)((long)local_4c8.
                                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar9 * 0x18);
          local_490.sz.width = 0;
          local_490.sz.height = 0;
          local_490.flags = 0x1010000;
          local_4a8.super__InputArray.sz.width = 0;
          local_4a8.super__InputArray.sz.height = 0;
          local_4a8.super__InputArray.flags = -0x7dfcfff4;
          local_4a8.super__InputArray.obj = local_4f8;
          local_478 = (undefined1  [8])&DAT_242ff400c;
          uStack_470 = (Mat *)CONCAT44(1,(int)((ulong)((long)pSVar1[1] - (long)*pSVar1) >> 3));
          local_448 = (MatAllocator *)0x0;
          pUStack_440 = (UMatData *)0x0;
          puStack_450 = (uchar *)0x0;
          SStack_460.width = 0;
          SStack_460.height = 0;
          local_430 = local_428;
          local_428[0] = 0;
          local_428[1] = 0;
          SVar3 = *pSVar1;
          if (SVar3 != pSVar1[1]) {
            local_428[1] = 8;
            local_428[0] = 8;
            puStack_450 = (uchar *)((((long)pSVar1[1] - (long)*pSVar1) * 0x20000000 >> 0x1d &
                                    0xfffffffffffffff8U) + (long)SVar3);
            SStack_460 = SVar3;
          }
          local_340.sz.width = 0;
          local_340.sz.height = 0;
          local_340.flags = 0x1010000;
          local_490.obj = (Mat *)local_2b0;
          SStack_468 = SStack_460;
          local_458 = puStack_450;
          local_438.p = (int *)&uStack_470;
          local_340.obj = (Mat *)local_478;
          local_2a0 = SStack_298;
          local_290 = puStack_288;
          dVar11 = (double)cv::arcLength(&local_340,true);
          cv::approxPolyDP(&local_490,&local_4a8,dVar11 * 0.02,true);
          cv::Mat::~Mat((Mat *)local_478);
          cv::Mat::~Mat((Mat *)local_2b0);
          lVar10 = (long)pMStack_4f0 - (long)local_4f8;
          if (lVar10 == 0x20) {
            local_328._0_8_ = &DAT_242ff400c;
            local_328.rows = 4;
            local_328.cols = 1;
            local_328.size.p = (int *)((long)&local_328 + 8);
            local_328.allocator = (MatAllocator *)0x0;
            local_328.u = (UMatData *)0x0;
            local_328.datalimit = (uchar *)0x0;
            local_328.datastart = (uchar *)0x0;
            local_328.step.p = local_328.step.buf;
            local_328.step.buf[0] = 0;
            local_328.step.buf[1] = 0;
            if (local_4f8 != (undefined1  [8])pMStack_4f0) {
              local_328.step.buf[1] = 8;
              local_328.step.buf[0] = 8;
              local_328.datastart = (uchar *)local_4f8;
              local_328.datalimit = (uchar *)((long)local_4f8 + 0x20);
            }
            local_358.sz.width = 0;
            local_358.sz.height = 0;
            local_358.flags = 0x1010000;
            local_358.obj = &local_328;
            local_328.data = local_328.datastart;
            local_328.dataend = local_328.datalimit;
            dVar11 = (double)cv::contourArea(&local_358,false);
            if (ABS(dVar11) <= 1000.0) goto LAB_00103d85;
            local_3d0._0_8_ = &DAT_242ff400c;
            local_3d0.rows = (int)((ulong)((long)pMStack_4f0 - (long)local_4f8) >> 3);
            local_3d0.cols = 1;
            local_3d0.size.p = (int *)((long)&local_3d0 + 8);
            local_3d0.allocator = (MatAllocator *)0x0;
            local_3d0.u = (UMatData *)0x0;
            local_3d0.datalimit = (uchar *)0x0;
            local_3d0.datastart = (uchar *)0x0;
            local_3d0.step.p = local_3d0.step.buf;
            local_3d0.step.buf[0] = 0;
            local_3d0.step.buf[1] = 0;
            if ((long)pMStack_4f0 - (long)local_4f8 != 0) {
              local_3d0.step.buf[1] = 8;
              local_3d0.step.buf[0] = 8;
              local_3d0.datastart = (uchar *)local_4f8;
              local_3d0.datalimit =
                   (uchar *)((long)&((Mat *)(&((Mat *)(&((Mat *)((MatStep *)((long)local_4f8 + 0x48)
                                                                + -3))->step + -3))->step + -3))->
                                    step +
                            (((long)pMStack_4f0 - (long)local_4f8) * 0x20000000 >> 0x1d &
                            0xfffffffffffffff8U) + 0xffffffffffffffb8);
            }
            local_370.sz.width = 0;
            local_370.sz.height = 0;
            local_370.flags = 0x1010000;
            local_370.obj = &local_3d0;
            local_3d0.data = local_3d0.datastart;
            local_3d0.dataend = local_3d0.datalimit;
            cVar6 = cv::isContourConvex(&local_370);
            bVar5 = true;
          }
          else {
LAB_00103d85:
            bVar5 = false;
            cVar6 = '\0';
          }
          if (bVar5) {
            cv::Mat::~Mat(&local_3d0);
          }
          if (lVar10 == 0x20) {
            cv::Mat::~Mat(&local_328);
          }
          if (cVar6 != '\0') {
            dVar11 = 0.0;
            lVar10 = 2;
            do {
              uVar8 = (ulong)((uint)lVar10 & 3);
              iVar7 = (int)((MatStep *)((long)local_4f8 + 0x48))->buf[lVar10 + -0xb];
              dVar4 = (double)(*(int *)((long)&((Mat *)(&((Mat *)(&((Mat *)((MatStep *)
                                                                            ((long)local_4f8 + 0x48)
                                                                           + -3))->step + -3))->step
                                                       + -3))->step + uVar8 * 8 + 0xffffffffffffffb8
                                       ) - iVar7);
              iVar2 = *(int *)((long)((MatStep *)((long)local_4f8 + 0x48))->buf + lVar10 * 8 + -0x54
                              );
              dVar14 = (double)(*(int *)((long)((MatStep *)((long)local_4f8 + 0x48))->buf +
                                        uVar8 * 8 + -0x4c) - iVar2);
              dVar15 = (double)((int)((MatStep *)((long)local_4f8 + 0x48))->buf[lVar10 + -0xc] -
                               iVar7);
              dVar16 = (double)(*(int *)((long)((MatStep *)((long)local_4f8 + 0x48))->buf +
                                        lVar10 * 8 + -0x5c) - iVar2);
              dVar12 = (dVar15 * dVar15 + dVar16 * dVar16) * (dVar4 * dVar4 + dVar14 * dVar14) +
                       1e-10;
              if (dVar12 < 0.0) {
                uStack_2c0 = 0;
                local_400 = dVar16;
                local_3f8 = dVar15;
                local_3f0 = dVar14;
                local_3e8 = dVar11;
                local_2c8 = dVar4;
                dVar12 = sqrt(dVar12);
                dVar13 = local_3e8;
                dVar14 = local_3f0;
                dVar15 = local_3f8;
                dVar16 = local_400;
                dVar4 = local_2c8;
              }
              else {
                dVar12 = SQRT(dVar12);
                dVar13 = dVar11;
              }
              dVar11 = ABS((dVar4 * dVar15 + dVar14 * dVar16) / dVar12);
              if (dVar11 <= dVar13) {
                dVar11 = dVar13;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != 5);
            if (dVar11 < 0.3) {
              std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::push_back(local_408,(value_type *)local_4f8);
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)(((long)local_4c8.
                                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_4c8.
                                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x5555555555555555));
      }
      if (local_4f8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_4f8,(long)local_4e8 - (long)local_4f8);
      }
      uVar9 = (ulong)((int)local_410 + 1);
    } while ((int)local_410 == 0);
    iVar7 = local_4d4 + 1;
    if (iVar7 == 3) {
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&local_4c8);
      cv::Mat::~Mat(&local_90);
      cv::Mat::~Mat((Mat *)local_150);
      cv::Mat::~Mat(&local_f0);
      return;
    }
  } while( true );
}

Assistant:

void find_rectangles(Mat& image, vector<vector<Point> >& rectangles)
{
    // blur will enhance edge detection
    Mat blurred(image);
    medianBlur(image, blurred, 9);

    Mat gray0(blurred.size(), CV_8U), gray;
    vector<vector<Point>> contours;

    // find rectangles in every color plane of the image
    for (int c = 0; c < 3; c++)
    {
        int ch[] = {c, 0};
        mixChannels(&blurred, 1, &gray0, 1, ch, 1);

        // try several threshold levels
        const int threshold_level = 2;
        for (int l = 0; l < threshold_level; l++)
        {
            // Use Canny instead of zero threshold level!
            // Canny helps to catch rectangles with gradient shading
            if (l == 0)
            {
                Canny(gray0, gray, 10, 20, 3); //
                // Dilate helps to remove potential holes between edge segments
                dilate(gray, gray, Mat(), Point(-1,-1));
            }
            else
            {
                    gray = gray0 >= (l+1) * 255 / threshold_level;
            }

            // Find contours and store them in a list
            findContours(gray, contours, RETR_LIST, CHAIN_APPROX_SIMPLE);

            // Test contours
            vector<Point> approx;
            for (size_t i = 0; i < contours.size(); i++)
            {
                    // approximate contour with accuracy proportional
                    // to the contour perimeter
                    approxPolyDP(Mat(contours[i]), approx, arcLength(Mat(contours[i]), true)*0.02, true);

                    // Note: absolute value of an area is used because
                    // area may be positive or negative - in accordance with the
                    // contour orientation
                    if (approx.size() == 4 &&
                            fabs(contourArea(Mat(approx))) > 1000 &&
                            isContourConvex(Mat(approx)))
                    {
                            double maxCosine = 0;

                            for (int j = 2; j < 5; j++)
                            {
                                    double cosine = fabs(angle(approx[j%4], approx[j-2], approx[j-1]));
                                    maxCosine = MAX(maxCosine, cosine);
                            }

                            if (maxCosine < 0.3)
                              rectangles.push_back(approx);
                    }
            }
        }
    }
}